

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::WindowDataParameter::MergePartialFromCodedStream
          (WindowDataParameter *this,CodedInputStream *input)

{
  byte bVar1;
  void *pvVar2;
  uint8 *puVar3;
  float *pfVar4;
  ArenaStringPtr *pAVar5;
  ArenaStringPtr *pAVar6;
  ArenaStringPtr *pAVar7;
  ArenaStringPtr *pAVar8;
  bool bVar9;
  uint32 uVar10;
  unsigned_long uVar11;
  byte *pbVar12;
  long lVar13;
  UnknownFieldSet *unknown_fields;
  string *psVar14;
  char cVar15;
  uint tag;
  ulong uVar16;
  float fVar17;
  pair<unsigned_long,_bool> pVar18;
  float local_54;
  ArenaStringPtr *local_50;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  
  local_38 = &this->root_folder_;
  local_40 = &this->crop_mode_;
  local_48 = &this->mean_file_;
  local_50 = &this->source_;
LAB_003b196f:
  pbVar12 = input->buffer_;
  uVar10 = 0;
  if (pbVar12 < input->buffer_end_) {
    bVar1 = *pbVar12;
    uVar10 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_003b1993;
    input->buffer_ = pbVar12 + 1;
    uVar16 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_003b1993:
    uVar10 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar10);
    uVar16 = 0;
    if (uVar10 - 1 < 0x7f) {
      uVar16 = 0x100000000;
    }
    uVar16 = uVar10 | uVar16;
  }
  pAVar8 = local_38;
  pAVar7 = local_40;
  pAVar6 = local_48;
  pAVar5 = local_50;
  tag = (uint)uVar16;
  if ((uVar16 & 0x100000000) == 0) goto switchD_003b1a08_default;
  cVar15 = (char)uVar16;
  switch((uint)(uVar16 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar15 == '\n') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      psVar14 = (this->source_).ptr_;
      if (psVar14 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (local_50,(string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar14 = pAVar5->ptr_;
      }
      bVar9 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar14);
      if (!bVar9) {
        return false;
      }
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((local_50->ptr_->_M_dataplus)._M_p,(int)local_50->ptr_->_M_string_length,PARSE,
                 "caffe.WindowDataParameter.source");
      goto LAB_003b196f;
    }
    break;
  case 2:
    if (cVar15 == '\x15') {
      pbVar12 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar12 = *pbVar12 | 2;
      pfVar4 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
        bVar9 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_54);
        fVar17 = local_54;
        if (!bVar9) {
          return false;
        }
      }
      else {
        fVar17 = *pfVar4;
        input->buffer_ = (uint8 *)(pfVar4 + 1);
      }
      this->scale_ = fVar17;
      goto LAB_003b196f;
    }
    break;
  case 3:
    if (cVar15 == '\x1a') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      psVar14 = (this->mean_file_).ptr_;
      if (psVar14 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (local_48,(string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar14 = pAVar6->ptr_;
      }
      bVar9 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar14);
      if (!bVar9) {
        return false;
      }
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((local_48->ptr_->_M_dataplus)._M_p,(int)local_48->ptr_->_M_string_length,PARSE,
                 "caffe.WindowDataParameter.mean_file");
      goto LAB_003b196f;
    }
    break;
  case 4:
    if (cVar15 != ' ') break;
    *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
    pbVar12 = input->buffer_;
    if (pbVar12 < input->buffer_end_) {
      bVar1 = *pbVar12;
      uVar10 = (uint32)bVar1;
      if (-1 < (char)bVar1) {
        this->batch_size_ = (uint)bVar1;
LAB_003b1bf7:
        input->buffer_ = pbVar12 + 1;
        goto LAB_003b196f;
      }
    }
    else {
      uVar10 = 0;
    }
    lVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
    this->batch_size_ = (uint32)lVar13;
LAB_003b1ded:
    if (lVar13 < 0) {
      return false;
    }
    goto LAB_003b196f;
  case 5:
    if (cVar15 == '(') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      pbVar12 = input->buffer_;
      if (pbVar12 < input->buffer_end_) {
        bVar1 = *pbVar12;
        uVar10 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->crop_size_ = (uint)bVar1;
          goto LAB_003b1bf7;
        }
      }
      else {
        uVar10 = 0;
      }
      lVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
      this->crop_size_ = (uint32)lVar13;
      goto LAB_003b1ded;
    }
    break;
  case 6:
    if (cVar15 == '0') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) &&
         (uVar11 = (unsigned_long)(char)*puVar3, -1 < (long)uVar11)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        pVar18 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar11 = pVar18.first;
        if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->mirror_ = uVar11 != 0;
      goto LAB_003b196f;
    }
    break;
  case 7:
    if (cVar15 == '=') {
      pbVar12 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar12 = *pbVar12 | 4;
      pfVar4 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
        bVar9 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_54);
        fVar17 = local_54;
        if (!bVar9) {
          return false;
        }
      }
      else {
        fVar17 = *pfVar4;
        input->buffer_ = (uint8 *)(pfVar4 + 1);
      }
      this->fg_threshold_ = fVar17;
      goto LAB_003b196f;
    }
    break;
  case 8:
    if (cVar15 == 'E') {
      pbVar12 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar12 = *pbVar12 | 8;
      pfVar4 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
        bVar9 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_54);
        fVar17 = local_54;
        if (!bVar9) {
          return false;
        }
      }
      else {
        fVar17 = *pfVar4;
        input->buffer_ = (uint8 *)(pfVar4 + 1);
      }
      this->bg_threshold_ = fVar17;
      goto LAB_003b196f;
    }
    break;
  case 9:
    if (cVar15 == 'M') {
      pbVar12 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar12 = *pbVar12 | 0x10;
      pfVar4 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
        bVar9 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_54);
        fVar17 = local_54;
        if (!bVar9) {
          return false;
        }
      }
      else {
        fVar17 = *pfVar4;
        input->buffer_ = (uint8 *)(pfVar4 + 1);
      }
      this->fg_fraction_ = fVar17;
      goto LAB_003b196f;
    }
    break;
  case 10:
    if (cVar15 == 'P') {
      pbVar12 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar12 = *pbVar12 | 1;
      pbVar12 = input->buffer_;
      if (pbVar12 < input->buffer_end_) {
        bVar1 = *pbVar12;
        uVar10 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->context_pad_ = (uint)bVar1;
          goto LAB_003b1bf7;
        }
      }
      else {
        uVar10 = 0;
      }
      lVar13 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
      this->context_pad_ = (uint32)lVar13;
      goto LAB_003b1ded;
    }
    break;
  case 0xb:
    if (cVar15 == 'Z') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      psVar14 = (this->crop_mode_).ptr_;
      if (psVar14 == (string *)&_default_crop_mode__abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (local_40,(string *)&_default_crop_mode__abi_cxx11_);
        psVar14 = pAVar7->ptr_;
      }
      bVar9 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar14);
      if (!bVar9) {
        return false;
      }
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((local_40->ptr_->_M_dataplus)._M_p,(int)local_40->ptr_->_M_string_length,PARSE,
                 "caffe.WindowDataParameter.crop_mode");
      goto LAB_003b196f;
    }
    break;
  case 0xc:
    if (cVar15 == '`') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) &&
         (uVar11 = (unsigned_long)(char)*puVar3, -1 < (long)uVar11)) {
        input->buffer_ = puVar3 + 1;
      }
      else {
        pVar18 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar11 = pVar18.first;
        if (((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->cache_images_ = uVar11 != 0;
      goto LAB_003b196f;
    }
    break;
  case 0xd:
    if (cVar15 == 'j') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      psVar14 = (this->root_folder_).ptr_;
      if (psVar14 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (local_38,(string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar14 = pAVar8->ptr_;
      }
      bVar9 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar14);
      if (!bVar9) {
        return false;
      }
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((local_38->ptr_->_M_dataplus)._M_p,(int)local_38->ptr_->_M_string_length,PARSE,
                 "caffe.WindowDataParameter.root_folder");
      goto LAB_003b196f;
    }
  }
switchD_003b1a08_default:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    unknown_fields =
         google::protobuf::internal::
         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
         ::mutable_unknown_fields_slow
                   (&(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   );
  }
  else {
    unknown_fields = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  bVar9 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
  if (!bVar9) {
    return false;
  }
  goto LAB_003b196f;
}

Assistant:

bool WindowDataParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.WindowDataParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string source = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_source()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->source().data(), this->source().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.source");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float scale = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_scale();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string mean_file = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_mean_file()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->mean_file().data(), this->mean_file().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.mean_file");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 batch_size = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_batch_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &batch_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 crop_size = 5 [default = 0];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_crop_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &crop_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool mirror = 6 [default = false];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_mirror();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &mirror_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float fg_threshold = 7 [default = 0.5];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(61u)) {
          set_has_fg_threshold();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &fg_threshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float bg_threshold = 8 [default = 0.5];
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(69u)) {
          set_has_bg_threshold();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &bg_threshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float fg_fraction = 9 [default = 0.25];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(77u)) {
          set_has_fg_fraction();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &fg_fraction_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 context_pad = 10 [default = 0];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_context_pad();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &context_pad_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string crop_mode = 11 [default = "warp"];
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_crop_mode()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->crop_mode().data(), this->crop_mode().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.crop_mode");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool cache_images = 12 [default = false];
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {
          set_has_cache_images();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &cache_images_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string root_folder = 13 [default = ""];
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_root_folder()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->root_folder().data(), this->root_folder().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.WindowDataParameter.root_folder");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.WindowDataParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.WindowDataParameter)
  return false;
#undef DO_
}